

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLCellLinOp::BndryCondLoc::BndryCondLoc
          (BndryCondLoc *this,BoxArray *ba,DistributionMapping *dm,int ncomp)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  size_type sVar4;
  pointer pGVar5;
  MFIter mfi;
  MFIter local_90;
  
  LayoutData<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>
  ::LayoutData(&this->bcond,ba,dm);
  LayoutData<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>::
  LayoutData(&this->bcloc,ba,dm);
  LayoutData<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*>::LayoutData(&this->bctl,ba,dm);
  uVar2 = (int)((ulong)((long)*(pointer *)
                               ((long)&(this->bctl).super_FabArrayBase.indexArray.
                                       super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + 8) -
                       (long)(this->bctl).super_FabArrayBase.indexArray.
                             super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2) * ncomp;
  (this->bctl_dv).m_data = (pointer)0x0;
  (this->bctl_dv).m_size = 0;
  (this->bctl_dv).m_capacity = 0;
  sVar4 = 1;
  if (1 < uVar2) {
    do {
      sVar4 = sVar4 * 3 + 1 >> 1;
    } while (sVar4 < (ulong)(long)(int)uVar2);
  }
  PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
  ::AllocateBuffer(&this->bctl_dv,sVar4);
  (this->bctl_dv).m_size = (long)(int)uVar2;
  this->m_ncomp = ncomp;
  pGVar5 = (this->bctl_dv).m_data;
  MFIter::MFIter(&local_90,&(this->bcloc).super_FabArrayBase,'\0');
  if (local_90.currentIndex < local_90.endIndex) {
    piVar1 = &local_90.currentIndex;
    sVar4 = (size_type)ncomp;
    do {
      piVar3 = piVar1;
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar3 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_90.currentIndex;
      }
      std::
      vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
      ::resize(&(this->bcond).m_data.
                super_vector<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[*piVar3].
                super_vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
               ,sVar4);
      piVar3 = piVar1;
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar3 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_90.currentIndex;
      }
      std::vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>::resize
                (&(this->bcloc).m_data.
                  super_vector<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar3].
                  super_vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,
                 sVar4);
      piVar3 = piVar1;
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar3 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_90.currentIndex;
      }
      (this->bctl).m_data.
      super_vector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*>_>
      .
      super__Vector_base<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[*piVar3] = pGVar5;
      MFIter::operator++(&local_90);
      pGVar5 = pGVar5 + sVar4;
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

MLCellLinOp::BndryCondLoc::BndryCondLoc (const BoxArray& ba, const DistributionMapping& dm, int ncomp)
    : bcond(ba, dm),
      bcloc(ba, dm),
      bctl(ba, dm),
      bctl_dv(bctl.local_size()*ncomp),
      m_ncomp(ncomp)
{
    auto dp = bctl_dv.data();
    for (MFIter mfi(bcloc); mfi.isValid(); ++mfi) {
        bcond[mfi].resize(ncomp);
        bcloc[mfi].resize(ncomp);
        bctl[mfi] = dp;
        dp += ncomp;
    }
}